

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O3

void __thiscall
t_javame_generator::generate_java_struct_reader
          (t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *tfield;
  ostream *poVar2;
  t_javame_generator *this_00;
  char *this_01;
  pointer pptVar3;
  string local_100;
  t_struct *local_e0;
  pointer local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_e0 = tstruct;
  t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_100._M_dataplus._M_p,local_100._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"public void read(TProtocol iprot) throws TException {",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_100._M_dataplus._M_p,local_100._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"TField field;",0xd);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"iprot.readStructBegin();",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"while (true)",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"field = iprot.readFieldBegin();",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"if (field.type == TType.STOP) { ",0x20)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"break;",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"switch (field.id) {",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar3 = (local_e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar3 !=
      (local_e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      poVar2 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"case ",5);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*pptVar3)->key_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": // ",5);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      this_00 = (t_javame_generator *)((*pptVar3)->name_)._M_dataplus._M_p;
      local_d8 = pptVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,this_00,
                 (pointer)((long)&(this_00->super_t_oop_generator).super_t_generator.
                                  _vptr_t_generator + ((*pptVar3)->name_)._M_string_length));
      constant_name(&local_100,this_00,&local_70);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_100._M_dataplus._M_p,local_100._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      pptVar3 = local_d8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar2 = t_generator::indent((t_generator *)this,out);
      this_01 = "if (field.type == ";
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"if (field.type == ",0x12);
      type_to_enum_abi_cxx11_(&local_100,(t_javame_generator *)this_01,(*pptVar3)->type_);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_100._M_dataplus._M_p,local_100._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") {",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      tfield = *pptVar3;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"this.","");
      generate_deserialize_field(this,out,tfield,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pptVar3 = local_d8;
      generate_isset_set(this,out,*local_d8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_100._M_dataplus._M_p,local_100._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} else { ",9);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"  TProtocolUtil.skip(iprot, field.type);",0x28);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"break;",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      pptVar3 = pptVar3 + 1;
    } while (pptVar3 !=
             (local_e0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"default:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"  TProtocolUtil.skip(iprot, field.type);",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"iprot.readFieldEnd();",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_100._M_dataplus._M_p,local_100._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"iprot.readStructEnd();",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"validate();",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_100._M_dataplus._M_p,local_100._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_javame_generator::generate_java_struct_reader(ostream& out, t_struct* tstruct) {
  out << indent() << "public void read(TProtocol iprot) throws TException {" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // Declare stack tmp variables and read struct header
  out << indent() << "TField field;" << endl << indent() << "iprot.readStructBegin();" << endl;

  // Loop over reading in fields
  indent(out) << "while (true)" << endl;
  scope_up(out);

  // Read beginning field marker
  indent(out) << "field = iprot.readFieldBegin();" << endl;

  // Check for field STOP marker and break
  indent(out) << "if (field.type == TType.STOP) { " << endl;
  indent_up();
  indent(out) << "break;" << endl;
  indent_down();
  indent(out) << "}" << endl;

  // Switch statement on the field we are reading
  indent(out) << "switch (field.id) {" << endl;

  indent_up();

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "case " << (*f_iter)->get_key() << ": // "
                << constant_name((*f_iter)->get_name()) << endl;
    indent_up();
    indent(out) << "if (field.type == " << type_to_enum((*f_iter)->get_type()) << ") {" << endl;
    indent_up();

    generate_deserialize_field(out, *f_iter, "this.");
    generate_isset_set(out, *f_iter);
    indent_down();
    out << indent() << "} else { " << endl << indent() << "  TProtocolUtil.skip(iprot, field.type);"
        << endl << indent() << "}" << endl << indent() << "break;" << endl;
    indent_down();
  }

  indent(out) << "default:" << endl;
  indent(out) << "  TProtocolUtil.skip(iprot, field.type);" << endl;

  indent_down();
  indent(out) << "}" << endl;

  // Read field end marker
  indent(out) << "iprot.readFieldEnd();" << endl;

  indent_down();
  indent(out) << "}" << endl;

  out << indent() << "iprot.readStructEnd();" << endl;

  // performs various checks (e.g. check that all required fields are set)
  indent(out) << "validate();" << endl;

  indent_down();
  out << indent() << "}" << endl << endl;
}